

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int getSubsamp(j_decompress_ptr dinfo)

{
  int iVar1;
  jpeg_component_info *pjVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint local_38;
  
  iVar6 = dinfo->num_components;
  lVar11 = (long)iVar6;
  if ((lVar11 == 1) && (dinfo->jpeg_color_space == JCS_GRAYSCALE)) {
    iVar6 = 3;
  }
  else {
    iVar12 = iVar6 + -1;
    local_38 = 0xffffffff;
    for (uVar7 = 0; uVar7 != 6; uVar7 = uVar7 + 1) {
      if ((iVar6 == pixelsize[uVar7]) ||
         (((iVar6 == 4 && (uVar7 != 3)) && ((dinfo->jpeg_color_space & ~JCS_GRAYSCALE) == JCS_CMYK))
         )) {
        pjVar2 = dinfo->comp_info;
        iVar1 = pjVar2->h_samp_factor;
        iVar3 = tjMCUWidth[uVar7] / 8;
        if ((iVar1 == iVar3) && (pjVar2->v_samp_factor == tjMCUHeight[uVar7] / 8)) {
          piVar8 = &pjVar2[1].v_samp_factor;
          iVar4 = 0;
          for (lVar10 = 1; lVar10 < lVar11; lVar10 = lVar10 + 1) {
            if (dinfo->jpeg_color_space == JCS_YCCK) {
              iVar5 = 1;
              iVar9 = 1;
              if (lVar10 == 3) {
LAB_0010bf47:
                iVar9 = iVar1;
                iVar5 = pjVar2->v_samp_factor;
              }
            }
            else {
              iVar5 = 1;
              iVar9 = 1;
              if (lVar10 == 3 && dinfo->jpeg_color_space == JCS_CMYK) goto LAB_0010bf47;
            }
            if (piVar8[-1] == iVar9) {
              iVar4 = iVar4 + (uint)(*piVar8 == iVar5);
            }
            piVar8 = piVar8 + 0x18;
          }
          if (iVar4 == iVar12) goto LAB_0010c06b;
        }
        iVar4 = pjVar2->v_samp_factor;
        if ((iVar4 == 2 && iVar1 == 2) && (((int)uVar7 == 4 || (iVar4 = 2, (int)uVar7 == 1)))) {
          piVar8 = &pjVar2[1].v_samp_factor;
          iVar9 = 0;
          for (lVar10 = 1; lVar10 < lVar11; lVar10 = lVar10 + 1) {
            iVar5 = tjMCUHeight[uVar7] / 8;
            iVar4 = iVar3;
            if (dinfo->jpeg_color_space == JCS_YCCK) {
              if (lVar10 == 3) {
LAB_0010bfe7:
                iVar5 = 2;
                iVar4 = 2;
              }
            }
            else if (lVar10 == 3 && dinfo->jpeg_color_space == JCS_CMYK) goto LAB_0010bfe7;
            if (piVar8[-1] == iVar5) {
              iVar9 = iVar9 + (uint)(*piVar8 == iVar4);
            }
            piVar8 = piVar8 + 0x18;
          }
          iVar4 = 2;
          if (iVar9 == iVar12) goto LAB_0010c06b;
        }
        if ((uVar7 == 0) && (iVar4 * iVar1 <= (int)(10 / (long)pixelsize[uVar7]))) {
          piVar8 = &pjVar2[1].v_samp_factor;
          lVar10 = 0;
          iVar3 = 0;
          do {
            lVar10 = lVar10 + 1;
            if (lVar11 <= lVar10) goto LAB_0010c05d;
            if (piVar8[-1] == iVar1) {
              iVar3 = iVar3 + (uint)(*piVar8 == iVar4);
            }
            piVar8 = piVar8 + 0x18;
          } while (iVar3 != iVar12);
          local_38 = 0;
        }
      }
LAB_0010c05d:
    }
    uVar7 = (ulong)local_38;
LAB_0010c06b:
    iVar6 = (int)uVar7;
  }
  return iVar6;
}

Assistant:

static int getSubsamp(j_decompress_ptr dinfo)
{
  int retval = -1, i, k;

  /* The sampling factors actually have no meaning with grayscale JPEG files,
     and in fact it's possible to generate grayscale JPEGs with sampling
     factors > 1 (even though those sampling factors are ignored by the
     decompressor.)  Thus, we need to treat grayscale as a special case. */
  if (dinfo->num_components == 1 && dinfo->jpeg_color_space == JCS_GRAYSCALE)
    return TJSAMP_GRAY;

  for (i = 0; i < NUMSUBOPT; i++) {
    if (dinfo->num_components == pixelsize[i] ||
        ((dinfo->jpeg_color_space == JCS_YCCK ||
          dinfo->jpeg_color_space == JCS_CMYK) &&
         pixelsize[i] == 3 && dinfo->num_components == 4)) {
      if (dinfo->comp_info[0].h_samp_factor == tjMCUWidth[i] / 8 &&
          dinfo->comp_info[0].v_samp_factor == tjMCUHeight[i] / 8) {
        int match = 0;

        for (k = 1; k < dinfo->num_components; k++) {
          int href = 1, vref = 1;

          if ((dinfo->jpeg_color_space == JCS_YCCK ||
               dinfo->jpeg_color_space == JCS_CMYK) && k == 3) {
            href = tjMCUWidth[i] / 8;  vref = tjMCUHeight[i] / 8;
          }
          if (dinfo->comp_info[k].h_samp_factor == href &&
              dinfo->comp_info[k].v_samp_factor == vref)
            match++;
        }
        if (match == dinfo->num_components - 1) {
          retval = i;  break;
        }
      }
      /* Handle 4:2:2 and 4:4:0 images whose sampling factors are specified
         in non-standard ways. */
      if (dinfo->comp_info[0].h_samp_factor == 2 &&
          dinfo->comp_info[0].v_samp_factor == 2 &&
          (i == TJSAMP_422 || i == TJSAMP_440)) {
        int match = 0;

        for (k = 1; k < dinfo->num_components; k++) {
          int href = tjMCUHeight[i] / 8, vref = tjMCUWidth[i] / 8;

          if ((dinfo->jpeg_color_space == JCS_YCCK ||
               dinfo->jpeg_color_space == JCS_CMYK) && k == 3) {
            href = vref = 2;
          }
          if (dinfo->comp_info[k].h_samp_factor == href &&
              dinfo->comp_info[k].v_samp_factor == vref)
            match++;
        }
        if (match == dinfo->num_components - 1) {
          retval = i;  break;
        }
      }
      /* Handle 4:4:4 images whose sampling factors are specified in
         non-standard ways. */
      if (dinfo->comp_info[0].h_samp_factor *
          dinfo->comp_info[0].v_samp_factor <=
          D_MAX_BLOCKS_IN_MCU / pixelsize[i] && i == TJSAMP_444) {
        int match = 0;
        for (k = 1; k < dinfo->num_components; k++) {
          if (dinfo->comp_info[k].h_samp_factor ==
              dinfo->comp_info[0].h_samp_factor &&
              dinfo->comp_info[k].v_samp_factor ==
              dinfo->comp_info[0].v_samp_factor)
            match++;
          if (match == dinfo->num_components - 1) {
            retval = i;  break;
          }
        }
      }
    }
  }
  return retval;
}